

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

free_ptr<LRQFAstate> scoped_calloc_or_throw<LRQFAstate>(void)

{
  LRQFAstate *__s;
  _Head_base<0UL,_LRQFAstate_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<LRQFAstate> fVar1;
  
  __s = calloc_or_throw<LRQFAstate>(1);
  memset(__s,0,0xc30);
  (__s->field_name)._M_dataplus._M_p = (pointer)&(__s->field_name).field_2;
  (__s->field_name).field_2._M_local_buf[0] = '\0';
  *(code **)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       destroy_free<LRQFAstate>;
  *(LRQFAstate **)((long)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8) =
       __s;
  fVar1._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQFAstate_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  fVar1._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<LRQFAstate>)
         fVar1._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}